

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rrRasterizer.cpp
# Opt level: O1

void __thiscall
rr::MultiSampleLineRasterizer::MultiSampleLineRasterizer
          (MultiSampleLineRasterizer *this,int numSamples,IVec4 *viewport)

{
  int iVar1;
  int i;
  long lVar2;
  
  this->m_numSamples = numSamples;
  lVar2 = 2;
  do {
    (this->m_triangleRasterizer0).m_viewport.m_data[lVar2 + -2] = viewport->m_data[lVar2 + -2];
    lVar2 = lVar2 + 1;
  } while (lVar2 != 6);
  (this->m_triangleRasterizer0).m_numSamples = numSamples;
  lVar2 = 0;
  (this->m_triangleRasterizer0).m_winding = WINDING_CCW;
  (this->m_triangleRasterizer0).m_horizontalFill = FILL_LEFT;
  (this->m_triangleRasterizer0).m_verticalFill = FILL_BOTTOM;
  (this->m_triangleRasterizer0).m_edge12.a = 0;
  (this->m_triangleRasterizer0).m_edge12.b = 0;
  *(undefined8 *)((long)&(this->m_triangleRasterizer0).m_edge12.b + 1) = 0;
  *(undefined8 *)((long)&(this->m_triangleRasterizer0).m_edge12.c + 1) = 0;
  (this->m_triangleRasterizer0).m_edge20.a = 0;
  (this->m_triangleRasterizer0).m_edge20.b = 0;
  *(undefined8 *)((long)&(this->m_triangleRasterizer0).m_edge20.b + 1) = 0;
  *(undefined8 *)((long)&(this->m_triangleRasterizer0).m_edge20.c + 1) = 0;
  (this->m_triangleRasterizer0).m_v0.m_data[0] = 0.0;
  (this->m_triangleRasterizer0).m_v0.m_data[1] = 0.0;
  (this->m_triangleRasterizer0).m_v0.m_data[2] = 0.0;
  (this->m_triangleRasterizer0).m_v0.m_data[3] = 0.0;
  (this->m_triangleRasterizer0).m_v1.m_data[0] = 0.0;
  (this->m_triangleRasterizer0).m_v1.m_data[1] = 0.0;
  (this->m_triangleRasterizer0).m_v1.m_data[2] = 0.0;
  (this->m_triangleRasterizer0).m_v1.m_data[3] = 0.0;
  (this->m_triangleRasterizer0).m_v2.m_data[0] = 0.0;
  (this->m_triangleRasterizer0).m_v2.m_data[1] = 0.0;
  (this->m_triangleRasterizer0).m_v2.m_data[2] = 0.0;
  (this->m_triangleRasterizer0).m_v2.m_data[3] = 0.0;
  (this->m_triangleRasterizer0).m_edge01.a = 0;
  (this->m_triangleRasterizer0).m_edge01.b = 0;
  *(undefined8 *)((long)&(this->m_triangleRasterizer0).m_edge01.b + 1) = 0;
  *(undefined8 *)((long)&(this->m_triangleRasterizer0).m_edge01.c + 1) = 0;
  (this->m_triangleRasterizer0).m_face = FACETYPE_LAST;
  *(undefined8 *)(this->m_triangleRasterizer0).m_bboxMin.m_data = 0;
  *(undefined8 *)(this->m_triangleRasterizer0).m_bboxMax.m_data = 0;
  *(undefined8 *)(this->m_triangleRasterizer0).m_curPos.m_data = 0;
  (this->m_triangleRasterizer0).m_viewportOrientation = VIEWPORTORIENTATION_LAST;
  iVar1 = this->m_numSamples;
  do {
    (this->m_triangleRasterizer1).m_viewport.m_data[lVar2] = viewport->m_data[lVar2];
    lVar2 = lVar2 + 1;
  } while (lVar2 != 4);
  (this->m_triangleRasterizer1).m_numSamples = iVar1;
  (this->m_triangleRasterizer1).m_winding = WINDING_CCW;
  (this->m_triangleRasterizer1).m_horizontalFill = FILL_LEFT;
  (this->m_triangleRasterizer1).m_verticalFill = FILL_BOTTOM;
  (this->m_triangleRasterizer1).m_edge12.a = 0;
  (this->m_triangleRasterizer1).m_edge12.b = 0;
  *(undefined8 *)((long)&(this->m_triangleRasterizer1).m_edge12.b + 1) = 0;
  *(undefined8 *)((long)&(this->m_triangleRasterizer1).m_edge12.c + 1) = 0;
  (this->m_triangleRasterizer1).m_edge20.a = 0;
  (this->m_triangleRasterizer1).m_edge20.b = 0;
  *(undefined8 *)((long)&(this->m_triangleRasterizer1).m_edge20.b + 1) = 0;
  *(undefined8 *)((long)&(this->m_triangleRasterizer1).m_edge20.c + 1) = 0;
  (this->m_triangleRasterizer1).m_v0.m_data[0] = 0.0;
  (this->m_triangleRasterizer1).m_v0.m_data[1] = 0.0;
  (this->m_triangleRasterizer1).m_v0.m_data[2] = 0.0;
  (this->m_triangleRasterizer1).m_v0.m_data[3] = 0.0;
  (this->m_triangleRasterizer1).m_v1.m_data[0] = 0.0;
  (this->m_triangleRasterizer1).m_v1.m_data[1] = 0.0;
  (this->m_triangleRasterizer1).m_v1.m_data[2] = 0.0;
  (this->m_triangleRasterizer1).m_v1.m_data[3] = 0.0;
  (this->m_triangleRasterizer1).m_v2.m_data[0] = 0.0;
  (this->m_triangleRasterizer1).m_v2.m_data[1] = 0.0;
  (this->m_triangleRasterizer1).m_v2.m_data[2] = 0.0;
  (this->m_triangleRasterizer1).m_v2.m_data[3] = 0.0;
  (this->m_triangleRasterizer1).m_edge01.a = 0;
  (this->m_triangleRasterizer1).m_edge01.b = 0;
  *(undefined8 *)((long)&(this->m_triangleRasterizer1).m_edge01.b + 1) = 0;
  *(undefined8 *)((long)&(this->m_triangleRasterizer1).m_edge01.c + 1) = 0;
  (this->m_triangleRasterizer1).m_face = FACETYPE_LAST;
  *(undefined8 *)(this->m_triangleRasterizer1).m_bboxMin.m_data = 0;
  *(undefined8 *)(this->m_triangleRasterizer1).m_bboxMax.m_data = 0;
  *(undefined8 *)(this->m_triangleRasterizer1).m_curPos.m_data = 0;
  (this->m_triangleRasterizer1).m_viewportOrientation = VIEWPORTORIENTATION_LAST;
  return;
}

Assistant:

MultiSampleLineRasterizer::MultiSampleLineRasterizer (const int numSamples, const tcu::IVec4& viewport)
	: m_numSamples			(numSamples)
	, m_triangleRasterizer0 (viewport, m_numSamples, RasterizationState())
	, m_triangleRasterizer1 (viewport, m_numSamples, RasterizationState())
{
}